

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

void __thiscall
Diligent::HLSL2GLSLConverterImpl::CreateStream
          (HLSL2GLSLConverterImpl *this,Char *InputFileName,
          IShaderSourceInputStreamFactory *pSourceStreamFactory,Char *HLSLSource,size_t NumSymbols,
          IHLSL2GLSLConversionStream **ppStream)

{
  IMemoryAllocator *Allocator;
  runtime_error *anon_var_0;
  MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,_Diligent::IMemoryAllocator>
  local_68;
  ConversionStream *local_40;
  ConversionStream *pStream;
  IHLSL2GLSLConversionStream **ppStream_local;
  size_t NumSymbols_local;
  Char *HLSLSource_local;
  IShaderSourceInputStreamFactory *pSourceStreamFactory_local;
  Char *InputFileName_local;
  HLSL2GLSLConverterImpl *this_local;
  
  pStream = (ConversionStream *)ppStream;
  ppStream_local = (IHLSL2GLSLConversionStream **)NumSymbols;
  NumSymbols_local = (size_t)HLSLSource;
  HLSLSource_local = (Char *)pSourceStreamFactory;
  pSourceStreamFactory_local = (IShaderSourceInputStreamFactory *)InputFileName;
  InputFileName_local = (Char *)this;
  Allocator = GetRawAllocator();
  MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,_Diligent::IMemoryAllocator>::
  MakeNewRCObj(&local_68,Allocator,"HLSL2GLSLConverterImpl::ConversionStream object instance",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x11a3,(IObject *)0x0);
  anon_var_0._3_1_ = 1;
  local_40 = MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
             ::operator()((MakeNewRCObj<Diligent::HLSL2GLSLConverterImpl::ConversionStream,Diligent::IMemoryAllocator>
                           *)&local_68,this,(char **)&pSourceStreamFactory_local,
                          (IShaderSourceInputStreamFactory **)&HLSLSource_local,
                          (char **)&NumSymbols_local,(unsigned_long *)&ppStream_local,
                          (bool *)((long)&anon_var_0 + 3));
  (**(local_40->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>).
     super_RefCountedObject<Diligent::IHLSL2GLSLConversionStream>.super_IHLSL2GLSLConversionStream.
     super_IObject._vptr_IObject)(local_40,IID_HLSL2GLSLConversionStream,pStream);
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::CreateStream(const Char*                      InputFileName,
                                          IShaderSourceInputStreamFactory* pSourceStreamFactory,
                                          const Char*                      HLSLSource,
                                          size_t                           NumSymbols,
                                          IHLSL2GLSLConversionStream**     ppStream) const
{
    try
    {
        auto* pStream = NEW_RC_OBJ(GetRawAllocator(), "HLSL2GLSLConverterImpl::ConversionStream object instance", ConversionStream)(*this, InputFileName, pSourceStreamFactory, HLSLSource, NumSymbols, true);
        pStream->QueryInterface(IID_HLSL2GLSLConversionStream, reinterpret_cast<IObject**>(ppStream));
    }
    catch (std::runtime_error&)
    {
        *ppStream = nullptr;
    }
}